

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

bool __thiscall
QGraphicsAnchorLayoutPrivate::replaceVertex
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation,AnchorVertex *oldV,
          AnchorVertex *newV,QList<QtGraphicsAnchorLayout::AnchorData_*> *edges)

{
  AnchorData *newAnchor;
  AnchorVertex *second;
  long lVar1;
  QPodArrayOps<QtGraphicsAnchorLayout::AnchorData*> *this_00;
  AnchorVertex **ppAVar2;
  AnchorData *pAVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  bool newFeasible;
  bool local_61;
  bool local_41;
  AnchorData *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((edges->d).size == 0) {
    local_61 = true;
  }
  else {
    lVar1 = (long)(int)orientation;
    this_00 = (QPodArrayOps<QtGraphicsAnchorLayout::AnchorData*> *)
              ((this->simplifiedVertices).m_data + lVar1 + 1);
    local_61 = true;
    uVar4 = 0;
    do {
      newAnchor = (edges->d).ptr[uVar4];
      if (newAnchor->from == oldV) {
        newAnchor->from = newV;
        ppAVar2 = &newAnchor->to;
      }
      else {
        ppAVar2 = &newAnchor->from;
        newAnchor->to = newV;
      }
      second = *ppAVar2;
      local_41 = true;
      pAVar3 = addAnchorMaybeParallel(this,newAnchor,&local_41);
      local_61 = (bool)(local_61 & local_41);
      if (pAVar3 != newAnchor) {
        local_40 = pAVar3;
        QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorData*>::
        emplace<QtGraphicsAnchorLayout::AnchorData*&>
                  (this_00,(this->simplifiedVertices).m_data[lVar1 + 1].d.size,&local_40);
        QList<QtGraphicsAnchorLayout::AnchorData_*>::end
                  ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)this_00);
      }
      Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::takeEdge
                ((this->graph).m_data + lVar1 + -1,oldV,second);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)(edges->d).size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_61;
}

Assistant:

bool QGraphicsAnchorLayoutPrivate::replaceVertex(Qt::Orientation orientation, AnchorVertex *oldV,
                                                 AnchorVertex *newV, const QList<AnchorData *> &edges)
{
    Graph<AnchorVertex, AnchorData> &g = graph[orientation];
    bool feasible = true;

    for (int i = 0; i < edges.size(); ++i) {
        AnchorData *ad = edges[i];
        AnchorVertex *otherV = replaceVertex_helper(ad, oldV, newV);

#if defined(QT_DEBUG)
        ad->name = QString::fromLatin1("%1 --to--> %2").arg(ad->from->toString(), ad->to->toString());
#endif

        bool newFeasible;
        AnchorData *newAnchor = addAnchorMaybeParallel(ad, &newFeasible);
        feasible &= newFeasible;

        if (newAnchor != ad) {
            // A parallel was created, we mark that in the list of anchors created by vertex
            // simplification. This is needed because we want to restore them in a separate step
            // from the restoration of anchor simplification.
            anchorsFromSimplifiedVertices[orientation].append(newAnchor);
        }

        g.takeEdge(oldV, otherV);
    }

    return feasible;
}